

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O1

void __thiscall FSerializer::Close(FSerializer *this)

{
  FWriter *this_00;
  FReader *pFVar1;
  DObject **ppDVar2;
  DThinker *pDVar3;
  long lVar4;
  ulong uVar5;
  
  this_00 = this->w;
  if (this_00 != (FWriter *)0x0) {
    FWriter::~FWriter(this_00);
    operator_delete(this_00,0x78);
    this->w = (FWriter *)0x0;
  }
  pFVar1 = this->r;
  if (pFVar1 != (FReader *)0x0) {
    uVar5 = (ulong)(pFVar1->mDObjects).Count;
    if (uVar5 != 0) {
      ppDVar2 = (pFVar1->mDObjects).Array;
      lVar4 = 0;
      do {
        pDVar3 = dyn_cast<DThinker>(*(DObject **)((long)ppDVar2 + lVar4));
        if ((pDVar3 != (DThinker *)0x0) &&
           ((pDVar3->NextThinker == (DThinker *)0x0 || (pDVar3->PrevThinker == (DThinker *)0x0)))) {
          (*(pDVar3->super_DObject)._vptr_DObject[4])(pDVar3);
        }
        lVar4 = lVar4 + 8;
      } while (uVar5 << 3 != lVar4);
    }
    pFVar1 = this->r;
    if (pFVar1 != (FReader *)0x0) {
      TArray<DObject_*,_DObject_*>::~TArray(&pFVar1->mDObjects);
      rapidjson::
      GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
      ::~GenericDocument(&pFVar1->mDoc);
      TArray<FJSONObject,_FJSONObject>::~TArray(&pFVar1->mObjects);
      operator_delete(pFVar1,0xb8);
    }
    this->r = (FReader *)0x0;
  }
  if (0 < this->mErrors) {
    I_Error("%d errors parsing JSON");
    return;
  }
  return;
}

Assistant:

void FSerializer::Close()
{	
	if (w != nullptr)
	{
		delete w;
		w = nullptr;
	}
	if (r != nullptr)
	{
		// we must explicitly delete all thinkers in the array which did not get linked into the thinker lists.
		// Otherwise these objects may survive a level deletion and point to incorrect data.
		for (auto &obj : r->mDObjects)
		{
			auto think = dyn_cast<DThinker>(obj);
			if (think != nullptr)
			{
				if (think->NextThinker == nullptr || think->PrevThinker == nullptr)
				{
					think->Destroy();
				}
			}
		}

		delete r;
		r = nullptr;
	}
	if (mErrors > 0)
	{
		I_Error("%d errors parsing JSON", mErrors);
	}
}